

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t driver::zeEventGetWaitScope(ze_event_handle_t hEvent,ze_event_scope_flags_t *pWaitScope)

{
  ze_result_t zVar1;
  
  if (DAT_0010d5e8 != (code *)0x0) {
    zVar1 = (*DAT_0010d5e8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventGetWaitScope(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_event_scope_flags_t* pWaitScope              ///< [out] wait event scope. This is the scope of relevant cache
                                                        ///< hierarchies invalidated on a wait action after the event is complete.
                                                        ///< May be 0 or a valid combination of ::ze_event_scope_flag_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetWaitScope = context.zeDdiTable.Event.pfnGetWaitScope;
        if( nullptr != pfnGetWaitScope )
        {
            result = pfnGetWaitScope( hEvent, pWaitScope );
        }
        else
        {
            // generic implementation
        }

        return result;
    }